

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::detail::Dispatch_Function::build_type_infos
          (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
           *__return_storage_ptr__,
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_funcs)

{
  bool bVar1;
  __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var2;
  element_type *peVar3;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *pvVar4;
  size_type sVar5;
  size_type sVar6;
  reference pvVar7;
  reference ti;
  type_info *local_80;
  type_info *local_78;
  uint local_70;
  ulong local_68;
  size_t i;
  undefined1 local_50 [8];
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> param_types;
  bool size_mismatch;
  const_iterator cStack_30;
  __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  *local_28;
  const_iterator *end;
  const_iterator begin;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  *t_funcs_local;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *type_infos;
  
  begin._M_current = (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)t_funcs;
  end = (const_iterator *)
        std::
        vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
        ::cbegin(t_funcs);
  cStack_30 = std::
              vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
              ::cend((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                      *)begin._M_current);
  local_28 = &stack0xffffffffffffffd0;
  bVar1 = __gnu_cxx::
          operator==<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                    ((__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                      *)&end,local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
              (__return_storage_ptr__);
  }
  else {
    param_types.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    p_Var2 = (__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)__gnu_cxx::
                __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                ::operator*((__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                             *)&end);
    peVar3 = std::
             __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var2);
    pvVar4 = dispatch::Proxy_Function_Base::get_param_types(peVar3);
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
              (__return_storage_ptr__,pvVar4);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
    ::operator++((__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                  *)&end);
    param_types.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                             ((__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                               *)&end,local_28), ((bVar1 ^ 0xffU) & 1) != 0) {
      p_Var2 = (__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                  ::operator*((__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                               *)&end);
      peVar3 = std::
               __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var2);
      pvVar4 = dispatch::Proxy_Function_Base::get_param_types(peVar3);
      std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
                ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_50,
                 pvVar4);
      sVar5 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                        ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                         local_50);
      sVar6 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                        (__return_storage_ptr__);
      if (sVar5 != sVar6) {
        param_types.
        super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      }
      local_68 = 0;
      while( true ) {
        sVar5 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                          (__return_storage_ptr__);
        bVar1 = false;
        if (local_68 < sVar5) {
          sVar5 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                              *)local_50);
          bVar1 = local_68 < sVar5;
        }
        if (!bVar1) break;
        pvVar7 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                 operator[](__return_storage_ptr__,local_68);
        ti = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::operator[]
                       ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                        local_50,local_68);
        bVar1 = Type_Info::operator==(pvVar7,ti);
        if (!bVar1) {
          Get_Type_Info<chaiscript::Boxed_Value>::get();
          pvVar7 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                   operator[](__return_storage_ptr__,local_68);
          pvVar7->m_type_info = local_80;
          pvVar7->m_bare_type_info = local_78;
          pvVar7->m_flags = local_70;
        }
        local_68 = local_68 + 1;
      }
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
      ::operator++((__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                    *)&end);
      std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector
                ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_50);
    }
    bVar1 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::empty
                      (__return_storage_ptr__);
    if (bVar1) {
      __assert_fail("!type_infos.empty() && \" type_info vector size is < 0, this is only possible if something else is broken\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/dispatchkit/dispatchkit.hpp"
                    ,0x130,
                    "static std::vector<Type_Info> chaiscript::detail::Dispatch_Function::build_type_infos(const std::vector<Proxy_Function> &)"
                   );
    }
    if ((param_types.
         super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
      std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::resize
                (__return_storage_ptr__,1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Type_Info> build_type_infos(const std::vector<Proxy_Function> &t_funcs) {
        auto begin = t_funcs.cbegin();
        const auto &end = t_funcs.cend();

        if (begin != end) {
          std::vector<Type_Info> type_infos = (*begin)->get_param_types();

          ++begin;

          bool size_mismatch = false;

          while (begin != end) {
            std::vector<Type_Info> param_types = (*begin)->get_param_types();

            if (param_types.size() != type_infos.size()) {
              size_mismatch = true;
            }

            for (size_t i = 0; i < type_infos.size() && i < param_types.size(); ++i) {
              if (!(type_infos[i] == param_types[i])) {
                type_infos[i] = detail::Get_Type_Info<Boxed_Value>::get();
              }
            }

            ++begin;
          }

          assert(!type_infos.empty() && " type_info vector size is < 0, this is only possible if something else is broken");

          if (size_mismatch) {
            type_infos.resize(1);
          }

          return type_infos;
        }

        return std::vector<Type_Info>();
      }